

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Keyword.cpp
# Opt level: O0

string * __thiscall
ninx::lexer::token::Keyword::dump_abi_cxx11_(string *__return_storage_ptr__,Keyword *this)

{
  ostream *poVar1;
  stringstream local_1a0 [8];
  stringstream s;
  ostream local_190 [376];
  Keyword *local_18;
  Keyword *this_local;
  
  local_18 = this;
  this_local = (Keyword *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"KEYWORD ( type ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->type);
  poVar1 = std::operator<<(poVar1," late:");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(bool)(this->late & 1));
  poVar1 = std::operator<<(poVar1," ): \'");
  poVar1 = std::operator<<(poVar1,(string *)&this->keyword);
  std::operator<<(poVar1,"\'");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string ninx::lexer::token::Keyword::dump() const {
    std::stringstream s;
    s << "KEYWORD ( type " << static_cast<int>(this-> type) << " late:" << this->late << " ): '" << this->keyword << "'";
    return s.str();
}